

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfdriver.c
# Opt level: O1

FT_UInt sfnt_get_name_index(FT_Face face,FT_String *glyph_name)

{
  ulong uVar1;
  FT_Error FVar2;
  int iVar3;
  char *in_RAX;
  FT_UInt FVar4;
  FT_UInt idx;
  ulong uVar5;
  char cVar6;
  FT_String *gname;
  char *local_38;
  
  uVar1 = face->num_glyphs;
  FVar4 = 0;
  if (-1 < (long)uVar1) {
    uVar5 = 0xffffffff;
    if (uVar1 < 0xffffffff) {
      uVar5 = uVar1;
    }
    if (uVar1 != 0) {
      idx = 0;
      local_38 = in_RAX;
      do {
        FVar2 = tt_face_get_ps_name((TT_Face)face,idx,&local_38);
        cVar6 = '\x06';
        if (FVar2 == 0) {
          iVar3 = strcmp(glyph_name,local_38);
          cVar6 = iVar3 == 0;
          if ((bool)cVar6) {
            FVar4 = idx;
          }
        }
        if ((cVar6 != '\x06') && (cVar6 != '\0')) {
          return FVar4;
        }
        idx = idx + 1;
      } while ((FT_UInt)uVar5 != idx);
    }
  }
  return 0;
}

Assistant:

static FT_UInt
  sfnt_get_name_index( FT_Face           face,
                       const FT_String*  glyph_name )
  {
    TT_Face  ttface = (TT_Face)face;

    FT_UInt  i, max_gid = FT_UINT_MAX;


    if ( face->num_glyphs < 0 )
      return 0;
    else if ( (FT_ULong)face->num_glyphs < FT_UINT_MAX )
      max_gid = (FT_UInt)face->num_glyphs;
    else
      FT_TRACE0(( "Ignore glyph names for invalid GID 0x%08x - 0x%08lx\n",
                  FT_UINT_MAX, face->num_glyphs ));

    for ( i = 0; i < max_gid; i++ )
    {
      FT_String*  gname;
      FT_Error    error = tt_face_get_ps_name( ttface, i, &gname );


      if ( error )
        continue;

      if ( !ft_strcmp( glyph_name, gname ) )
        return i;
    }

    return 0;
  }